

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

uint utf8_next_char(string *input,size_type *i)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  int length;
  size_type *i_local;
  string *input_local;
  
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
  if (*pcVar5 == '\0') {
    input_local._4_4_ = 0;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
    iVar4 = utf8_sequence((int)*pcVar5);
    *i = (long)iVar4 + *i;
    if (iVar4 == 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      input_local._4_4_ = (uint)*pcVar5;
    }
    else if (iVar4 == 2) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      input_local._4_4_ = ((int)cVar1 & 0x1fU) * 0x40 + ((int)*pcVar5 & 0x3fU);
    }
    else if (iVar4 == 3) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar2 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      input_local._4_4_ =
           ((int)cVar1 & 0xfU) * 0x1000 + ((int)cVar2 & 0x3fU) * 0x40 + ((int)*pcVar5 & 0x3fU);
    }
    else if (iVar4 == 4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar2 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar3 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      input_local._4_4_ =
           ((int)cVar1 & 7U) * 0x40000 + ((int)cVar2 & 0x3fU) * 0x1000 + ((int)cVar3 & 0x3fU) * 0x40
           + ((int)*pcVar5 & 0x3fU);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)input);
      input_local._4_4_ = (uint)*pcVar5;
    }
  }
  return input_local._4_4_;
}

Assistant:

unsigned int utf8_next_char (const std::string& input, std::string::size_type& i)
{
  if (input[i] == '\0')
    return 0;

  // How many bytes in the sequence?
  int length = utf8_sequence (input[i]);
  i += length;

  // 0xxxxxxx -> 0xxxxxxx
  if (length == 1)
    return input[i - 1];

  // 110yyyyy 10xxxxxx -> 00000yyy yyxxxxxx
  if (length == 2)
    return ((input[i - 2] & 0x1F) << 6) +
            (input[i - 1] & 0x3F);

  // 1110zzzz 10yyyyyy 10xxxxxx -> zzzzyyyy yyxxxxxx
  if (length == 3)
    return ((input[i - 3] & 0xF)  << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // 11110www 10zzzzzz 10yyyyyy 10xxxxxx -> 000wwwzz zzzzyyyy yyxxxxxx
  if (length == 4)
    return ((input[i - 4] & 0x7)  << 18) +
           ((input[i - 3] & 0x3F) << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // Default: pretend as though it's a single character.
  // TODO Or should this throw?
  return input[i - 1];
}